

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool __thiscall
caffe::NetParameter::MergePartialFromCodedStream(NetParameter *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  char *data;
  uint uVar4;
  bool bVar5;
  uint32 uVar6;
  UnknownFieldSet *unknown_fields;
  string *psVar7;
  LayerParameter *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  Type *pTVar8;
  BlobShape *value_01;
  V1LayerParameter *value_02;
  NetState *value_03;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  bool *value_04;
  
  this_00 = &this->input_;
LAB_00489249:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar6 = (uint)bVar2, (~(uint)*pbVar1 & uVar10) < 0x80)) goto LAB_004894aa;
        uVar10 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_004894aa:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_004892a7;
    uVar4 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    switch(uVar4) {
    case 1:
      if (cVar9 != '\n') goto LAB_004892a7;
      psVar7 = mutable_name_abi_cxx11_(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar7);
      if (!bVar5) {
        return false;
      }
      psVar7 = (this->name_).ptr_;
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((psVar7->_M_dataplus)._M_p,(int)psVar7->_M_string_length,PARSE,
                 "caffe.NetParameter.name");
      goto LAB_00489249;
    case 2:
      if (cVar9 != '\x12') goto LAB_004892a7;
      value_02 = google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::Add(&this->layers_);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::V1LayerParameter>(input,value_02);
      break;
    case 3:
      if (cVar9 != '\x1a') goto LAB_004892a7;
      value_00 = google::protobuf::
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(this_00);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value_00);
      if (!bVar5) {
        return false;
      }
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,
                          (this->input_).super_RepeatedPtrFieldBase.current_size_ + -1);
      data = (pTVar8->_M_dataplus)._M_p;
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,
                          (this->input_).super_RepeatedPtrFieldBase.current_size_ + -1);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar8->_M_string_length,PARSE,"caffe.NetParameter.input");
      goto LAB_00489249;
    case 4:
      if (cVar9 == '\"') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->input_dim_);
      }
      else {
        if ((uVar10 & 0xff) != 0x20) goto LAB_004892a7;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,0x20,input,&this->input_dim_);
      }
      break;
    case 5:
      if (cVar9 != '(') goto LAB_004892a7;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      value_04 = &this->force_backward_;
LAB_0048948e:
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,value_04);
      break;
    case 6:
      if (cVar9 != '2') goto LAB_004892a7;
      value_03 = mutable_state(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::NetState>
                        (input,value_03);
      break;
    case 7:
      if (cVar9 == '8') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        value_04 = &this->debug_info_;
        goto LAB_0048948e;
      }
LAB_004892a7:
      if (uVar10 == 0) {
        return true;
      }
      if ((uVar10 & 7) == 4) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar10,unknown_fields);
      break;
    case 8:
      if (cVar9 != 'B') goto LAB_004892a7;
      value_01 = google::protobuf::RepeatedPtrField<caffe::BlobShape>::Add(&this->input_shape_);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::BlobShape>
                        (input,value_01);
      break;
    default:
      if ((uVar4 != 100) || (cVar9 != '\"')) goto LAB_004892a7;
      value = google::protobuf::RepeatedPtrField<caffe::LayerParameter>::Add(&this->layer_);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::LayerParameter>(input,value);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.V1LayerParameter layers = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string input = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_input()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->input(this->input_size() - 1).data(),
            this->input(this->input_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.input");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 input_dim = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 32u, input, this->mutable_input_dim())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_input_dim())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool force_backward = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_force_backward();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &force_backward_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.NetState state = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_state()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool debug_info = 7 [default = false];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_debug_info();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &debug_info_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobShape input_shape = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_input_shape()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.LayerParameter layer = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetParameter)
  return false;
#undef DO_
}